

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O1

void __thiscall Imf_2_5::TypedDeepImageChannel<half>::resize(TypedDeepImageChannel<half> *this)

{
  ulong uVar1;
  half **pphVar2;
  
  DeepImageChannel::resize(&this->super_DeepImageChannel);
  if (this->_sampleListPointers != (half **)0x0) {
    operator_delete__(this->_sampleListPointers);
  }
  this->_sampleListPointers = (half **)0x0;
  uVar1 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  pphVar2 = (half **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
  this->_sampleListPointers = pphVar2;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[8])(this);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::resize ()
{
    DeepImageChannel::resize();

    delete [] _sampleListPointers;
    _sampleListPointers = 0;
    _sampleListPointers = new T * [numPixels()];
    initializeSampleLists();
}